

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int toLocaltime(DateTime *p,sqlite3_context *pCtx)

{
  int iVar1;
  int iVar2;
  tm *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int iYearDiff;
  DateTime x;
  tm sLocal;
  time_t t;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  long local_78;
  int local_70;
  undefined1 local_50;
  int local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  int local_38;
  int local_34;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  memset(&local_48,0xaa,0x38);
  memset(&local_48,0,0x38);
  computeJD((DateTime *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if ((*in_RDI < 0xbfc83e532200) || (0xc1bc387b0a00 < *in_RDI)) {
    memcpy(&local_78,&DAT_002af4f0,0x30);
    memcpy(&local_78,in_RDI,0x30);
    computeYMD_HMS((DateTime *)0x22efcb);
    iVar1 = (local_70 % 4 + 2000) - local_70;
    local_70 = iVar1 + local_70;
    local_50 = 0;
    computeJD((DateTime *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  else {
    iVar1 = 0;
    local_78 = *in_RDI;
  }
  local_10 = (undefined1 *)(local_78 / 1000 + -0x3118a36940);
  iVar2 = osLocaltime(in_RDI,in_RSI);
  if (iVar2 == 0) {
    *(int *)(in_RDI + 1) = (local_34 + 0x76c) - iVar1;
    *(int *)((long)in_RDI + 0xc) = local_38 + 1;
    *(undefined4 *)(in_RDI + 2) = local_3c;
    *(undefined4 *)((long)in_RDI + 0x14) = local_40;
    *(undefined4 *)(in_RDI + 3) = local_44;
    in_RDI[4] = (long)((double)(*in_RDI % 1000) * 0.001 + (double)local_48);
    *(undefined1 *)((long)in_RDI + 0x29) = 1;
    *(undefined1 *)((long)in_RDI + 0x2a) = 1;
    *(undefined1 *)(in_RDI + 5) = 0;
    *(byte *)((long)in_RDI + 0x2c) = *(byte *)((long)in_RDI + 0x2c) & 0xfe;
    *(undefined4 *)((long)in_RDI + 0x1c) = 0;
    *(byte *)((long)in_RDI + 0x2c) = *(byte *)((long)in_RDI + 0x2c) & 0xfd;
  }
  else {
    sqlite3_result_error
              ((sqlite3_context *)in_RSI,(char *)CONCAT44(iVar1,in_stack_ffffffffffffff68),0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)(iVar2 != 0);
  }
  __stack_chk_fail();
}

Assistant:

static int toLocaltime(
  DateTime *p,                   /* Date at which to calculate offset */
  sqlite3_context *pCtx          /* Write error here if one occurs */
){
  time_t t;
  struct tm sLocal;
  int iYearDiff;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  computeJD(p);
  if( p->iJD<2108667600*(i64)100000 /* 1970-01-01 */
   || p->iJD>2130141456*(i64)100000 /* 2038-01-18 */
  ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    DateTime x = *p;
    computeYMD_HMS(&x);
    iYearDiff = (2000 + x.Y%4) - x.Y;
    x.Y += iYearDiff;
    x.validJD = 0;
    computeJD(&x);
    t = (time_t)(x.iJD/1000 -  21086676*(i64)10000);
  }else{
    iYearDiff = 0;
    t = (time_t)(p->iJD/1000 -  21086676*(i64)10000);
  }
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    return SQLITE_ERROR;
  }
  p->Y = sLocal.tm_year + 1900 - iYearDiff;
  p->M = sLocal.tm_mon + 1;
  p->D = sLocal.tm_mday;
  p->h = sLocal.tm_hour;
  p->m = sLocal.tm_min;
  p->s = sLocal.tm_sec + (p->iJD%1000)*0.001;
  p->validYMD = 1;
  p->validHMS = 1;
  p->validJD = 0;
  p->rawS = 0;
  p->tz = 0;
  p->isError = 0;
  return SQLITE_OK;
}